

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  bool bVar1;
  int iVar2;
  size_t max;
  long lVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  byte bVar12;
  CURLcode CVar13;
  byte *__s;
  bool bVar14;
  bool bVar15;
  int local_4c;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  local_4c = 0;
  pcVar6 = (char *)0x0;
LAB_00127eef:
  pcVar9 = conn_to_host->data;
  if (*pcVar9 == ':') {
    pcVar9 = pcVar9 + 1;
    bVar14 = true;
LAB_00127f9a:
    CVar13 = CURLE_OK;
    if (bVar14) {
      if (*pcVar9 != ':') {
        pcVar8 = strchr(pcVar9,0x3a);
        if (pcVar8 != (char *)0x0) {
          local_38 = (char *)0x0;
          lVar3 = strtol(pcVar9,&local_38,10);
          if (local_38 == pcVar8) {
            bVar15 = lVar3 == conn->remote_port;
            if (bVar15) {
              pcVar9 = pcVar8 + 1;
            }
            goto LAB_00127fec;
          }
        }
        goto LAB_00127fea;
      }
      bVar15 = true;
      pcVar9 = pcVar9 + 1;
    }
    else {
LAB_00127fea:
      bVar15 = false;
    }
LAB_00127fec:
    bVar1 = true;
    if ((!bVar14) || (bVar1 = true, !bVar15)) goto LAB_00128239;
    if (*pcVar9 == '\0') {
      local_4c = -1;
      pcVar6 = (char *)0x0;
      CVar13 = CURLE_OK;
      goto LAB_00128239;
    }
    pbVar4 = (byte *)(*Curl_cstrdup)(pcVar9);
    if (pbVar4 == (byte *)0x0) {
      local_4c = -1;
      CVar13 = CURLE_OUT_OF_MEMORY;
      pcVar6 = (char *)0x0;
      bVar1 = false;
      goto LAB_00128239;
    }
    pbVar11 = pbVar4;
    __s = pbVar4;
    if (*pbVar4 == 0x5b) {
      pbVar11 = pbVar4 + 1;
      bVar12 = pbVar4[1];
      __s = pbVar11;
      if (bVar12 != 0) {
        ppuVar5 = __ctype_b_loc();
        __s = pbVar4 + 2;
        do {
          if (((((*ppuVar5)[bVar12] >> 0xc & 1) == 0) && (bVar12 != 0x2e)) && (bVar12 != 0x3a)) {
            if (bVar12 == 0x25) {
              iVar2 = strncmp("%25",(char *)(__s + -1),3);
              if (iVar2 != 0) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
              }
              bVar12 = *__s;
              if (bVar12 == 0) goto LAB_0012814f;
              goto LAB_0012811e;
            }
            break;
          }
          bVar12 = *__s;
          __s = __s + 1;
        } while (bVar12 != 0);
        __s = __s + -1;
      }
      goto LAB_0012814f;
    }
    goto LAB_00128176;
  }
  bVar14 = (conn->bits).ipv6_ip != false;
  pcVar8 = "";
  pcVar10 = "";
  if (bVar14) {
    pcVar10 = "[";
  }
  if (bVar14) {
    pcVar8 = "]";
  }
  bVar14 = false;
  pcVar8 = curl_maprintf("%s%s%s",pcVar10,(conn->host).name,pcVar8);
  if (pcVar8 != (char *)0x0) {
    max = strlen(pcVar8);
    iVar2 = curl_strnequal(pcVar9,pcVar8,max);
    (*Curl_cfree)(pcVar8);
    if (iVar2 == 0) {
      bVar14 = false;
    }
    else {
      bVar14 = pcVar9[max] == ':';
    }
    pcVar9 = pcVar9 + max + 1;
  }
  if (pcVar8 != (char *)0x0) goto LAB_00127f9a;
  CVar13 = CURLE_OUT_OF_MEMORY;
  bVar1 = false;
  goto LAB_00128239;
  while( true ) {
    bVar12 = __s[1];
    __s = __s + 1;
    if (bVar12 == 0) break;
LAB_0012811e:
    if (((((*ppuVar5)[bVar12] & 0x1400) == 0) && (1 < bVar12 - 0x2d)) &&
       ((bVar12 != 0x5f && (bVar12 != 0x7e)))) break;
  }
LAB_0012814f:
  if (*__s == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00128176:
  pcVar6 = strchr((char *)__s,0x3a);
  if (pcVar6 != (char *)0x0) {
    local_38 = (char *)0x0;
    *pcVar6 = '\0';
    if (pcVar6[1] != '\0') {
      uVar7 = strtol(pcVar6 + 1,&local_38,10);
      if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar7 < 0x10000))
      goto LAB_001281f1;
      Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar6 + 1);
      pbVar11 = (byte *)0x0;
    }
  }
  uVar7 = 0xffffffff;
LAB_001281f1:
  local_4c = (int)uVar7;
  bVar1 = true;
  if (pbVar11 == (byte *)0x0) {
    pcVar6 = (char *)0x0;
    CVar13 = CURLE_OK;
  }
  else {
    pcVar6 = (*Curl_cstrdup)((char *)pbVar11);
    CVar13 = CURLE_OK;
    if (pcVar6 == (char *)0x0) {
      CVar13 = CURLE_OUT_OF_MEMORY;
      local_4c = -1;
      bVar1 = false;
    }
  }
  (*Curl_cfree)(pbVar4);
LAB_00128239:
  if (!bVar1) {
    return CVar13;
  }
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    (conn->bits).conn_to_host = false;
    (*Curl_cfree)(pcVar6);
  }
  else {
    (conn->conn_to_host).rawalloc = pcVar6;
    (conn->conn_to_host).name = pcVar6;
    (conn->bits).conn_to_host = true;
    pcVar9 = strchr(pcVar6,0x3a);
    pcVar8 = "[";
    if (pcVar9 == (char *)0x0) {
      pcVar8 = "";
    }
    pcVar10 = "]";
    if (pcVar9 == (char *)0x0) {
      pcVar10 = "";
    }
    Curl_infof(data,"Connecting to hostname: %s%s%s\n",pcVar8,pcVar6,pcVar10);
  }
  if (local_4c < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = local_4c;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n");
  }
  conn_to_host = conn_to_host->next;
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  if (pcVar6 != (char *)0x0) {
    return CURLE_OK;
  }
  goto LAB_00127eef;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = 0;

  while(conn_to_host && !host) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      bool ipv6host;
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      ipv6host = strchr(host, ':') != NULL;
      infof(data, "Connecting to hostname: %s%s%s\n",
            ipv6host ? "[" : "", host, ipv6host ? "]" : "");
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      free(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}